

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

bool __thiscall Disa::Adjacency_Graph<false>::insert(Adjacency_Graph<false> *this,Edge *edge)

{
  ulong uVar1;
  bool bVar2;
  ostream *poVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  iterator iVar6;
  reference puVar7;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_178 [2];
  unsigned_long *local_168;
  unsigned_long *local_160;
  unsigned_long *local_158;
  unsigned_long *local_150;
  size_t local_148;
  unsigned_long *local_140;
  unsigned_long *i_second_vertex;
  unsigned_long *i_first_vertex;
  pair<const_unsigned_long_&,_const_unsigned_long_&> *local_120;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  Edge *local_20;
  Edge *edge_local;
  Adjacency_Graph<false> *this_local;
  
  local_20 = edge;
  edge_local = (Edge *)this;
  if (edge->first != edge->second) {
    bVar2 = contains(this,edge);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      _i_first_vertex = order_edge_vertex(local_20);
      local_120 = (pair<const_unsigned_long_&,_const_unsigned_long_&> *)&i_first_vertex;
      i_second_vertex = std::get<0ul,unsigned_long_const&,unsigned_long_const&>(local_120);
      local_140 = std::get<1ul,unsigned_long_const&,unsigned_long_const&>(local_120);
      puVar4 = std::max<unsigned_long>(i_second_vertex,local_140);
      uVar1 = *puVar4;
      sVar5 = size_vertex(this);
      if (sVar5 <= uVar1) {
        puVar4 = std::max<unsigned_long>(i_second_vertex,local_140);
        local_148 = *puVar4 + 1;
        resize(this,&local_148);
      }
      insert_vertex_adjacent_list(this,*i_second_vertex,*local_140);
      local_158 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->offset);
      local_150 = (unsigned_long *)
                  std::
                  next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_158,*i_second_vertex + 1);
      local_168 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->offset);
      local_160 = (unsigned_long *)
                  std::
                  next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )local_168,*local_140 + 2);
      std::
      for_each<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Graph<false>::insert(std::pair<unsigned_long,unsigned_long>const&)::_lambda(unsigned_long&)_1_>
                (local_150,local_160);
      insert_vertex_adjacent_list(this,*local_140,*i_second_vertex);
      iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->offset);
      local_178[0] = std::
                     next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                               (iVar6._M_current,*local_140 + 1);
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_178);
      *puVar7 = *puVar7 + 1;
      iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->offset);
      _Var8 = std::
              next<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (iVar6._M_current,*local_140 + 2);
      iVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->offset);
      std::
      for_each<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Disa::Adjacency_Graph<false>::insert(std::pair<unsigned_long,unsigned_long>const&)::_lambda(unsigned_long&)_2_>
                (_Var8._M_current,iVar6._M_current);
      this_local._7_1_ = true;
    }
    return this_local._7_1_;
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
  local_48 = &PTR_s__workspace_llm4binary_github_lic_001bf3c8;
  console_format_abi_cxx11_(&local_40,(Disa *)0x0,(Log_Level)&local_48,(source_location *)edge);
  poVar3 = std::operator<<(poVar3,(string *)&local_40);
  std::__cxx11::to_string(&local_f8,local_20->first);
  std::operator+(&local_d8,"Edge vertices identical, ",&local_f8);
  std::operator+(&local_b8,&local_d8," and ");
  std::__cxx11::to_string(&local_118,local_20->second);
  std::operator+(&local_98,&local_b8,&local_118);
  std::operator+(&local_78,&local_98,".");
  poVar3 = std::operator<<(poVar3,(string *)&local_78);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_40);
  exit(1);
}

Assistant:

bool Adjacency_Graph<_directed>::insert(const Edge& edge) {
  ASSERT_DEBUG(edge.first != edge.second,
               "Edge vertices identical, " + std::to_string(edge.first) + " and " + std::to_string(edge.second) + ".");

  // Preliminaries check if the edge exists, then determine if we need to resize.
  if(contains(edge)) return false;
  const auto& [i_first_vertex, i_second_vertex] =
  !_directed ? order_edge_vertex(&edge) : std::pair<const std::size_t&, const std::size_t&>({edge.first, edge.second});
  if(std::max(i_first_vertex, i_second_vertex) >= size_vertex()) resize(std::max(i_first_vertex, i_second_vertex) + 1);

  // Insert lower vertex.
  insert_vertex_adjacent_list(i_first_vertex, i_second_vertex);
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_first_vertex + 1)),
                !_directed ? std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)) : offset.end(),
                [](std::size_t& off) { off++; });
  if(_directed) return true;

  // Insert upper vertex (tricky: last for loop is safe -> The highest vertex + 1 (for size) + 1 (for offset) <= end()).
  insert_vertex_adjacent_list(i_second_vertex, i_first_vertex);
  ++(*std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 1)));
  std::for_each(std::next(offset.begin(), static_cast<s_size_t>(i_second_vertex + 2)), offset.end(),
                [](std::size_t& off) { off += 2; });

  return true;
}